

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O3

void __thiscall
vkt::texture::anon_unknown_0::Texture3DMinLodTestInstance::getReferenceParams
          (Texture3DMinLodTestInstance *this,ReferenceParams *params,int cellNdx)

{
  params->minLod =
       *(float *)(texture::(anonymous_namespace)::getMinLodForCell(int)::s_values +
                 (long)(cellNdx % 0x10) * 4);
  return;
}

Assistant:

float getMinLodForCell (int cellNdx)
{
	static const float s_values[] =
	{
		1.0f,
		3.5f,
		2.0f,
		-2.0f,
		0.0f,
		3.0f,
		10.0f,
		4.8f,
		5.8f,
		5.7f,
		-1.9f,
		4.0f,
		6.5f,
		7.1f,
		-1e10,
		1000.f
	};
	return s_values[cellNdx % DE_LENGTH_OF_ARRAY(s_values)];
}